

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O0

void google::protobuf::compiler::java::GenerateLarge
               (Printer *printer,EnumDescriptor *descriptor,
               vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               *canonical_values,
               vector<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>_>_>
               *aliases,bool immutable_api,Context *context,ClassNameResolver *name_resolver)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  EnumDescriptor *pEVar1;
  bool bVar2;
  size_type sVar3;
  EnumOptions *this;
  AlphaNum *a;
  AlphaNum *a_00;
  double dVar4;
  undefined1 auVar5 [16];
  string_view sVar6;
  Sub *local_1a28;
  Sub *local_1990;
  basic_string_view<char,_std::char_traits<char>_> local_1830;
  undefined1 local_1819;
  anon_class_24_3_51fb375c_for_cb local_1818;
  allocator<char> local_17f9;
  string local_17f8;
  anon_class_24_3_51fb375c_for_cb local_17d8;
  allocator<char> local_17b9;
  string local_17b8;
  anon_class_24_3_51fb375c_for_cb local_1798;
  allocator<char> local_1779;
  string local_1778;
  anon_class_32_4_ba3f933f_for_cb local_1758;
  allocator<char> local_1731;
  string local_1730;
  anon_class_16_2_d8d71c34_for_cb local_1710;
  allocator<char> local_16f9;
  string local_16f8;
  AlphaNum local_16d8;
  string local_16a8;
  allocator<char> local_1681;
  string local_1680;
  string_view local_1660;
  allocator<char> local_1649;
  string local_1648;
  Sub *local_1628;
  Sub local_1620;
  Sub local_1568;
  Sub local_14b0;
  Sub local_13f8;
  Sub local_1340;
  Sub local_1288;
  Sub local_11d0;
  iterator local_1118;
  size_type local_1110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1108;
  int local_10f4 [2];
  int start;
  int count;
  undefined8 local_10e0;
  undefined1 local_10d1;
  undefined1 local_10d0 [32];
  bool *local_10b0;
  allocator<char> local_10a1;
  string local_10a0;
  anon_class_16_2_d8d71c34_for_cb local_1080;
  allocator<char> local_1069;
  string local_1068;
  anon_class_24_3_c50c339d_for_cb local_1048;
  allocator<char> local_1029;
  string local_1028;
  anon_class_16_2_be738b9a_for_cb local_1008;
  allocator<char> local_ff1;
  string local_ff0;
  anon_class_16_2_be738b9a_for_cb local_fd0;
  allocator<char> local_fb9;
  string local_fb8;
  anon_class_16_2_d8d71c34_for_cb local_f98;
  allocator<char> local_f81;
  string local_f80;
  anon_class_16_2_bd81fb56_for_cb local_f60;
  allocator<char> local_f49;
  string local_f48;
  anon_class_32_4_f8866bbb_for_cb local_f28;
  allocator<char> local_f01;
  string local_f00;
  anon_class_24_3_a16c8ddb_for_cb local_ee0;
  allocator<char> local_ec1;
  string local_ec0;
  anon_class_24_3_4f0b22dd_for_cb local_ea0;
  allocator<char> local_e81;
  string local_e80;
  anon_class_16_2_d8d71c34_for_cb local_e60;
  allocator<char> local_e49;
  string local_e48;
  anon_class_16_2_d8d71c34_for_cb local_e28;
  allocator<char> local_e11;
  string local_e10;
  char *local_df0;
  allocator<char> local_de1;
  string local_de0;
  AlphaNum local_dc0;
  string local_d90;
  allocator<char> local_d69;
  string local_d68;
  char *local_d48;
  allocator<char> local_d39;
  string local_d38;
  char *local_d18;
  allocator<char> local_d09;
  string local_d08;
  string_view local_ce8 [2];
  allocator<char> local_cc1;
  string local_cc0;
  Sub *local_ca0;
  Sub local_c98;
  Sub local_be0;
  Sub local_b28;
  Sub local_a70;
  Sub local_9b8;
  Sub local_900;
  Sub local_848;
  Sub local_790;
  Sub local_6d8;
  Sub local_620;
  Sub local_568;
  Sub local_4b0;
  Sub local_3f8;
  Sub local_340;
  Sub local_288;
  Sub local_1d0;
  Sub local_118;
  iterator local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_50;
  undefined1 local_40 [8];
  int interface_count;
  int kMaxEnums;
  Context *context_local;
  undefined8 uStack_28;
  bool immutable_api_local;
  vector<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  *aliases_local;
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *canonical_values_local;
  EnumDescriptor *descriptor_local;
  Printer *printer_local;
  
  local_40._4_4_ = 1000;
  _interface_count = context;
  context_local._7_1_ = immutable_api;
  uStack_28 = aliases;
  aliases_local =
       (vector<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>_>_>
        *)canonical_values;
  canonical_values_local =
       (vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        *)descriptor;
  descriptor_local = (EnumDescriptor *)printer;
  sVar3 = std::
          vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::size(canonical_values);
  auVar5._8_4_ = (int)(sVar3 >> 0x20);
  auVar5._0_8_ = sVar3;
  auVar5._12_4_ = 0x45300000;
  dVar4 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) / 1000.0);
  pEVar1 = descriptor_local;
  local_40._0_4_ = (undefined4)dVar4;
  local_10d1 = 1;
  local_ca0 = &local_c98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc0,"classname",&local_cc1);
  local_ce8[0] = EnumDescriptor::name((EnumDescriptor *)canonical_values_local);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_c98,&local_cc0,local_ce8);
  local_ca0 = &local_be0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"static",&local_d09);
  bVar2 = IsOwnFile<google::protobuf::EnumDescriptor>
                    ((EnumDescriptor *)canonical_values_local,(bool)(context_local._7_1_ & 1));
  local_d18 = " static ";
  if (bVar2) {
    local_d18 = " ";
  }
  io::Printer::Sub::Sub<char_const*>(&local_be0,&local_d08,&local_d18);
  local_ca0 = &local_b28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d38,"deprecation",&local_d39);
  this = EnumDescriptor::options((EnumDescriptor *)canonical_values_local);
  bVar2 = EnumOptions::deprecated(this);
  local_d48 = "";
  if (bVar2) {
    local_d48 = "@java.lang.Deprecated";
  }
  io::Printer::Sub::Sub<char_const*>(&local_b28,&local_d38,&local_d48);
  local_ca0 = &local_a70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d68,"canonical_values_size",&local_d69);
  sVar3 = std::
          vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::size(canonical_values);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_dc0,sVar3);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_d90,(lts_20250127 *)&local_dc0,a);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_a70,&local_d68,&local_d90);
  local_ca0 = &local_9b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_de0,"proto_enum_class",&local_de1);
  bVar2 = Context::EnforceLite((Context *)_interface_count);
  local_df0 = "com.google.protobuf.ProtocolMessageEnum";
  if (bVar2) {
    local_df0 = "com.google.protobuf.Internal.EnumLite";
  }
  io::Printer::Sub::Sub<char_const*>(&local_9b8,&local_de0,&local_df0);
  local_ca0 = &local_900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e10,"proto_non_null_annotation",&local_e11);
  local_e28.context = (Context **)&interface_count;
  local_e28.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__0>
            (&local_900,&local_e10,&local_e28);
  local_ca0 = &local_848;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e48,"method_return_null_annotation",&local_e49);
  local_e60.context = (Context **)&interface_count;
  local_e60.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__1>
            (&local_848,&local_e48,&local_e60);
  local_ca0 = &local_790;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e80,"interface_names",&local_e81);
  local_ea0.interface_count = (int *)local_40;
  local_ea0.descriptor = (EnumDescriptor **)&canonical_values_local;
  local_ea0.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__2>
            (&local_790,&local_e80,&local_ea0);
  local_ca0 = &local_6d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ec0,"gen_code_version_validator",&local_ec1);
  local_ee0.context = (Context **)&interface_count;
  local_ee0.printer = (Printer **)&descriptor_local;
  local_ee0.descriptor = (EnumDescriptor **)&canonical_values_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__3>
            (&local_6d8,&local_ec0,&local_ee0);
  local_ca0 = &local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f00,"aliases",&local_f01);
  local_f28.printer = (Printer **)&descriptor_local;
  local_f28.context = (Context **)&interface_count;
  local_f28.aliases = aliases;
  local_f28.canonical_values = canonical_values;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__4>
            (&local_620,&local_f00,&local_f28);
  local_ca0 = &local_568;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f48,"get_number_func",&local_f49);
  local_f60.descriptor = (EnumDescriptor **)&canonical_values_local;
  local_f60.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__5>
            (&local_568,&local_f48,&local_f60);
  local_ca0 = &local_4b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f80,"deprecated_value_of_func",&local_f81);
  local_f98.context = (Context **)&interface_count;
  local_f98.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__6>
            (&local_4b0,&local_f80,&local_f98);
  local_ca0 = &local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fb8,"for_number_func",&local_fb9);
  local_fd0.interface_count = (int *)local_40;
  local_fd0.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__7>
            (&local_3f8,&local_fb8,&local_fd0);
  local_ca0 = &local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ff0,"value_of_func",&local_ff1);
  local_1008.interface_count = (int *)local_40;
  local_1008.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__8>
            (&local_340,&local_ff0,&local_1008);
  local_ca0 = &local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1028,"values_func",&local_1029);
  local_1048.printer = (Printer **)&descriptor_local;
  local_1048.descriptor = (EnumDescriptor **)&canonical_values_local;
  local_1048.interface_count = (int *)local_40;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__9>
            (&local_288,&local_1028,&local_1048);
  local_ca0 = &local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1068,"enum_verifier_func",&local_1069);
  local_1080.context = (Context **)&interface_count;
  local_1080.printer = (Printer **)&descriptor_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__10>
            (&local_1d0,&local_1068,&local_1080);
  local_ca0 = &local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10a0,"descriptor_methods",&local_10a1);
  local_10d0._0_8_ = &canonical_values_local;
  local_10d0._8_8_ = &interface_count;
  local_10d0._16_8_ = &descriptor_local;
  local_10d0._24_8_ = &name_resolver;
  local_10b0 = (bool *)((long)&context_local + 7);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__11>
            (&local_118,&local_10a0,(anon_class_40_5_84860369_for_cb *)local_10d0);
  local_10d1 = 0;
  local_60 = &local_c98;
  local_58 = 0x11;
  v_00._M_len = 0x11;
  v_00._M_array = local_60;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_50._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&count,
             "\n        $proto_non_null_annotation$\n        $deprecation$\n        public$static$final class $classname$\n          implements $proto_enum_class$, java.io.Serializable, $interface_names$ {\n          static {\n            $gen_code_version_validator$\n          }\n\n          public static final $classname$ UNRECOGNIZED = new $classname$(-1, $canonical_values_size$, \"UNRECOGNIZED\");\n\n          $aliases$\n\n          $deprecated_value_of_func$\n\n          public final int getNumber() {\n            $get_number_func$\n          }\n\n          /**\n           * @param value The numeric wire value of the corresponding enum entry.\n           * @return The enum associated with the given numeric wire value.\n           */\n          $method_return_null_annotation$\n          public static $classname$ forNumber(int value) {\n            $for_number_func$\n          }\n\n          /**\n           * @param name The string name of the corresponding enum entry.\n           * @return The enum associated with the given string name.\n           */\n          public static $classname$ valueOf(String name) {\n            $value_of_func$\n          }\n\n          public static $classname$[] values() {\n            $values_func$\n          }\n\n          private final int value;\n          private final String name;\n          private final int index;\n\n          $classname$(int v, int i, String n) {\n            this.value = v;\n            this.index = i;\n            this.name = n;\n          }\n\n          public int index() {\n            return index;\n          }\n\n          public int value() {\n            return value;\n          }\n\n          public String name() {\n            return name;\n          }\n\n          // For Kotlin code.\n          public String getName() {\n            return name;\n          }\n\n          @java.lang.Override\n          public String toString() {\n            return name;\n          }\n\n          public static com.google.protobuf.Internal.EnumLiteMap<$classname$> internalGetValueMap() {\n            return internalValueMap;\n          }\n\n          p..." /* TRUNCATED STRING LITERAL */
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)pEVar1,local_50._M_allocated_capacity,local_50._8_8_,_count,
                    local_10e0);
  local_1990 = (Sub *)&local_60;
  do {
    local_1990 = local_1990 + -1;
    io::Printer::Sub::~Sub(local_1990);
  } while (local_1990 != &local_c98);
  std::__cxx11::string::~string((string *)&local_10a0);
  std::allocator<char>::~allocator(&local_10a1);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::__cxx11::string::~string((string *)&local_1028);
  std::allocator<char>::~allocator(&local_1029);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::allocator<char>::~allocator(&local_ff1);
  std::__cxx11::string::~string((string *)&local_fb8);
  std::allocator<char>::~allocator(&local_fb9);
  std::__cxx11::string::~string((string *)&local_f80);
  std::allocator<char>::~allocator(&local_f81);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator(&local_f49);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator(&local_f01);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::allocator<char>::~allocator(&local_ec1);
  std::__cxx11::string::~string((string *)&local_e80);
  std::allocator<char>::~allocator(&local_e81);
  std::__cxx11::string::~string((string *)&local_e48);
  std::allocator<char>::~allocator(&local_e49);
  std::__cxx11::string::~string((string *)&local_e10);
  std::allocator<char>::~allocator(&local_e11);
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator(&local_de1);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator(&local_d69);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator(&local_d39);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator(&local_d09);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  for (local_10f4[1] = 0; pEVar1 = descriptor_local, local_10f4[1] < (int)local_40._0_4_;
      local_10f4[1] = local_10f4[1] + 1) {
    local_10f4[0] = local_10f4[1] * 1000;
    local_1819 = 1;
    local_1628 = &local_1620;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1648,"classname",&local_1649);
    sVar6 = EnumDescriptor::name((EnumDescriptor *)canonical_values_local);
    local_1660 = sVar6;
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              (&local_1620,&local_1648,&local_1660);
    local_1628 = &local_1568;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1680,"count",&local_1681);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_16d8,local_10f4[1]);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_16a8,(lts_20250127 *)&local_16d8,a_00);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_1568,&local_1680,&local_16a8);
    local_1628 = &local_14b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16f8,"method_return_null_annotation",&local_16f9);
    local_1710.context = (Context **)&interface_count;
    local_1710.printer = (Printer **)&descriptor_local;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__12>
              (&local_14b0,&local_16f8,&local_1710);
    local_1628 = &local_13f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1730,"enums",&local_1731);
    local_1758.start = local_10f4;
    local_1758.printer = (Printer **)&descriptor_local;
    local_1758.context = (Context **)&interface_count;
    local_1758.canonical_values = canonical_values;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__13>
              (&local_13f8,&local_1730,&local_1758);
    local_1628 = &local_1340;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1778,"value_of_func",&local_1779);
    local_1798.printer = (Printer **)&descriptor_local;
    local_1798.start = local_10f4;
    local_1798.canonical_values = canonical_values;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__14>
              (&local_1340,&local_1778,&local_1798);
    local_1628 = &local_1288;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_17b8,"for_number_func",&local_17b9);
    local_17d8.printer = (Printer **)&descriptor_local;
    local_17d8.start = local_10f4;
    local_17d8.canonical_values = canonical_values;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__15>
              (&local_1288,&local_17b8,&local_17d8);
    local_1628 = &local_11d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_17f8,"values_func",&local_17f9);
    local_1818.printer = (Printer **)&descriptor_local;
    local_1818.start = local_10f4;
    local_1818.canonical_values = canonical_values;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::java::GenerateLarge(google::protobuf::io::Printer*,google::protobuf::EnumDescriptor_const*,std::vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>,std::vector<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>,std::allocator<std::pair<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>>>,bool,google::protobuf::compiler::java::Context*,google::protobuf::compiler::java::ClassNameResolver*)::__16>
              (&local_11d0,&local_17f8,&local_1818);
    local_1819 = 0;
    local_1118 = &local_1620;
    local_1110 = 7;
    v._M_len = 7;
    v._M_array = local_1118;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_1108._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1830,
               "\n          interface $classname$$count$ {\n\n            $enums$\n\n            /**\n             * @param value The numeric wire value of the corresponding enum entry.\n             * @return The enum associated with the given numeric wire value.\n             */\n            $method_return_null_annotation$\n            public static $classname$ forNumber$count$(int value) {\n              $for_number_func$\n            }\n\n            /**\n             * @param name The string name of the corresponding enum entry.\n             * @return The enum associated with the given string name.\n             */\n            $method_return_null_annotation$\n            public static $classname$ valueOf$count$(String name) {\n              $value_of_func$\n            }\n\n            public static $classname$[] values$count$() {\n              $values_func$\n            }\n          }\n        "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)pEVar1,local_1108._M_allocated_capacity,local_1108._8_8_,
                      local_1830._M_len,local_1830._M_str);
    local_1a28 = (Sub *)&local_1118;
    do {
      local_1a28 = local_1a28 + -1;
      io::Printer::Sub::~Sub(local_1a28);
    } while (local_1a28 != &local_1620);
    std::__cxx11::string::~string((string *)&local_17f8);
    std::allocator<char>::~allocator(&local_17f9);
    std::__cxx11::string::~string((string *)&local_17b8);
    std::allocator<char>::~allocator(&local_17b9);
    std::__cxx11::string::~string((string *)&local_1778);
    std::allocator<char>::~allocator(&local_1779);
    std::__cxx11::string::~string((string *)&local_1730);
    std::allocator<char>::~allocator(&local_1731);
    std::__cxx11::string::~string((string *)&local_16f8);
    std::allocator<char>::~allocator(&local_16f9);
    std::__cxx11::string::~string((string *)&local_16a8);
    std::__cxx11::string::~string((string *)&local_1680);
    std::allocator<char>::~allocator(&local_1681);
    std::__cxx11::string::~string((string *)&local_1648);
    std::allocator<char>::~allocator(&local_1649);
  }
  return;
}

Assistant:

void GenerateLarge(
    io::Printer* printer, const EnumDescriptor* descriptor,
    std::vector<const EnumValueDescriptor*> canonical_values,
    std::vector<
        std::pair<const EnumValueDescriptor*, const EnumValueDescriptor*>>
        aliases,
    bool immutable_api, Context* context, ClassNameResolver* name_resolver) {
  // Max number of constants in a generated Java class.
  constexpr int kMaxEnums = 1000;
  int interface_count = ceil((double)canonical_values.size() / kMaxEnums);

  printer->Emit(
      {{"classname", descriptor->name()},
       {"static", IsOwnFile(descriptor, immutable_api) ? " " : " static "},
       {"deprecation",
        descriptor->options().deprecated() ? "@java.lang.Deprecated" : ""},
       {"canonical_values_size", absl::StrCat(canonical_values.size())},
       {"proto_enum_class", context->EnforceLite()
                                ? "com.google.protobuf.Internal.EnumLite"
                                : "com.google.protobuf.ProtocolMessageEnum"},
       {"proto_non_null_annotation",
        [&] {
          if (!context->options().opensource_runtime) {
            printer->Emit(R"(
              @com.google.protobuf.Internal.ProtoNonnullApi
            )");
          }
        }},
       {"method_return_null_annotation",
        [&] {
          if (!context->options().opensource_runtime) {
            printer->Emit(R"(
              @com.google.protobuf.Internal.ProtoMethodMayReturnNull
            )");
          }
        }},
       {"interface_names",
        [&] {
          std::vector<std::string> interface_names;
          interface_names.reserve(interface_count);
          for (int count = 0; count < interface_count; count++) {
            interface_names.push_back(
                absl::StrFormat("%s%d", descriptor->name(), count));
          }
          printer->Emit(
              {{"interface_names", absl::StrJoin(interface_names, ", ")}},
              R"($interface_names$)");
        }},
       {"gen_code_version_validator",
        [&] {
          if (!context->EnforceLite()) {
            PrintGencodeVersionValidator(printer,
                                         context->options().opensource_runtime,
                                         descriptor->name());
          }
        }},
       {"aliases",
        [&] {
          for (int i = 0; i < aliases.size(); i++) {
            WriteEnumValueDocComment(printer, aliases[i].first,
                                     context->options());
            printer->Emit({{"name", aliases[i].first->name()},
                           {"canonical_name", aliases[i].second->name()}},
                          R"(
                  public static final $classname$ $name$ = $canonical_name$;
                )");
            printer->Annotate("name", canonical_values[i]);
          }
        }},
       {"get_number_func",
        [&] {
          if (!descriptor->is_closed()) {
            printer->Emit(R"(
                if (this == UNRECOGNIZED) {
                  throw new java.lang.IllegalArgumentException(
                    "Can't get the number of an unknown enum value.");
                }
              )");
          }
          printer->Emit(R"(
            return value;
          )");
        }},
       {"deprecated_value_of_func",
        [&] {
          if (context->options().opensource_runtime) {
            printer->Emit(R"(
              /**
               * @param value The numeric wire value of the corresponding enum entry.
               * @return The enum associated with the given numeric wire value.
               * @deprecated Use {@link #forNumber(int)} instead.
               */
              @java.lang.Deprecated
              public static $classname$ valueOf(int value) {
                return forNumber(value);
              }
          )");
          }
        }},
       {"for_number_func",
        [&] {
          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
                if ($classname$$count$.forNumber$count$(value) != null) {
                  return $classname$$count$.forNumber$count$(value);
                }
                )");
          }
          printer->Emit(R"(
                return null;
                )");
        }},
       {"value_of_func",
        [&] {
          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
              if ($classname$$count$.valueOf$count$(name) != null) {
                return $classname$$count$.valueOf$count$(name);
              }
            )");
          }
          printer->Emit(R"(
              throw new java.lang.IllegalArgumentException(
                "No enum constant $classname$." + name);
          )");
        }},
       {"values_func",
        [&] {
          printer->Emit({{"size", absl::StrCat(descriptor->value_count() + 1)}},
                        R"(
              int ordinal = 0;
              $classname$[] values = new $classname$[$size$];
          )");

          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
              $classname$[] values$count$ = $classname$$count$.values$count$();
              System.arraycopy(values$count$, 0, values, ordinal, values$count$.length);
              ordinal += values$count$.length;
            )");
          }
          printer->Emit(
              {{"last_index", absl::StrCat(descriptor->value_count())}}, R"(
              values[$last_index$] = UNRECOGNIZED;
              return values;
          )");
        }},
       {"enum_verifier_func",
        [&] {
          if (context->EnforceLite()) {
            printer->Emit(R"(
                public static com.google.protobuf.Internal.EnumVerifier
                    internalGetVerifier() {
                  return $classname$Verifier.INSTANCE;
                }

                private static final class $classname$Verifier implements
                     com.google.protobuf.Internal.EnumVerifier {
                        static final com.google.protobuf.Internal.EnumVerifier
                          INSTANCE = new $classname$Verifier();
                        @java.lang.Override
                        public boolean isInRange(int number) {
                          return $classname$.forNumber(number) != null;
                        }
                      };
            )");
          }
        }},
       {"descriptor_methods",
        [&] {
          // -----------------------------------------------------------------
          // Reflection

          if (HasDescriptorMethods(descriptor, context->EnforceLite())) {
            printer->Print(
                "public final "
                "com.google.protobuf.Descriptors.EnumValueDescriptor\n"
                "    getValueDescriptor() {\n");
            if (!descriptor->is_closed()) {
              printer->Print(
                  "  if (this == UNRECOGNIZED) {\n"
                  "    throw new java.lang.IllegalStateException(\n"
                  "        \"Can't get the descriptor of an unrecognized enum "
                  "value.\");\n"
                  "  }\n");
            }
            printer->Print(
                "  return getDescriptor().getValues().get(index());\n"
                "}\n"
                "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
                "    getDescriptorForType() {\n"
                "  return getDescriptor();\n"
                "}\n"
                "public static final "
                "com.google.protobuf.Descriptors.EnumDescriptor\n"
                "    getDescriptor() {\n");

            // TODO:  Cache statically?  Note that we can't access
            // descriptors
            //   at module init time because it wouldn't work with
            //   descriptor.proto, but we can cache the value the first time
            //   getDescriptor() is called.
            if (descriptor->containing_type() == nullptr) {
              // The class generated for the File fully populates the descriptor
              // with extensions in both the mutable and immutable cases. (In
              // the mutable api this is accomplished by attempting to load the
              // immutable outer class).
              printer->Print(
                  "  return "
                  "$file$.getDescriptor().getEnumTypes().get($index$);\n",
                  "file",
                  name_resolver->GetClassName(descriptor->file(),
                                              immutable_api),
                  "index", absl::StrCat(descriptor->index()));
            } else {
              printer->Print(
                  "  return "
                  "$parent$.$descriptor$.getEnumTypes().get($index$);\n",
                  "parent",
                  name_resolver->GetClassName(descriptor->containing_type(),
                                              immutable_api),
                  "descriptor",
                  descriptor->containing_type()
                          ->options()
                          .no_standard_descriptor_accessor()
                      ? "getDefaultInstance().getDescriptorForType()"
                      : "getDescriptor()",
                  "index", absl::StrCat(descriptor->index()));
            }
            printer->Print(
                "}\n"
                "\n");

            printer->Print(
                "\n"
                "public static $classname$ valueOf(\n"
                "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) "
                "{\n"
                "  if (desc.getType() != getDescriptor()) {\n"
                "    throw new java.lang.IllegalArgumentException(\n"
                "      \"EnumValueDescriptor is not for this type.\");\n"
                "  }\n",
                "classname", descriptor->name());
            if (!descriptor->is_closed()) {
              printer->Print(
                  "  if (desc.getIndex() == -1) {\n"
                  "    return UNRECOGNIZED;\n"
                  "  }\n");
            }
            printer->Print(
                "  return values()[desc.getIndex()];\n"
                "}\n"
                "\n");
          }
        }}},
      R"(
        $proto_non_null_annotation$
        $deprecation$
        public$static$final class $classname$
          implements $proto_enum_class$, java.io.Serializable, $interface_names$ {
          static {
            $gen_code_version_validator$
          }

          public static final $classname$ UNRECOGNIZED = new $classname$(-1, $canonical_values_size$, "UNRECOGNIZED");

          $aliases$

          $deprecated_value_of_func$

          public final int getNumber() {
            $get_number_func$
          }

          /**
           * @param value The numeric wire value of the corresponding enum entry.
           * @return The enum associated with the given numeric wire value.
           */
          $method_return_null_annotation$
          public static $classname$ forNumber(int value) {
            $for_number_func$
          }

          /**
           * @param name The string name of the corresponding enum entry.
           * @return The enum associated with the given string name.
           */
          public static $classname$ valueOf(String name) {
            $value_of_func$
          }

          public static $classname$[] values() {
            $values_func$
          }

          private final int value;
          private final String name;
          private final int index;

          $classname$(int v, int i, String n) {
            this.value = v;
            this.index = i;
            this.name = n;
          }

          public int index() {
            return index;
          }

          public int value() {
            return value;
          }

          public String name() {
            return name;
          }

          // For Kotlin code.
          public String getName() {
            return name;
          }

          @java.lang.Override
          public String toString() {
            return name;
          }

          public static com.google.protobuf.Internal.EnumLiteMap<$classname$> internalGetValueMap() {
            return internalValueMap;
          }

          private static final com.google.protobuf.Internal.EnumLiteMap<
            $classname$> internalValueMap =
              new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {
                public $classname$ findValueByNumber(int number) {
                  return $classname$.forNumber(number);
                }
              };

          $enum_verifier_func$

          $descriptor_methods$
        }

        )");

  for (int count = 0; count < interface_count; count++) {
    int start = count * kMaxEnums;
    printer->Emit(
        {{"classname", descriptor->name()},
         {"count", absl::StrCat(count)},
         {"method_return_null_annotation",
          [&] {
            if (!context->options().opensource_runtime) {
              printer->Emit(R"(
                          @com.google.protobuf.Internal.ProtoMethodMayReturnNull
                        )");
            }
          }},
         {"enums",
          [&] {
            for (int i = start;
                 i < std::min(start + kMaxEnums, (int)canonical_values.size());
                 i++) {
              WriteEnumValueDocComment(printer, canonical_values[i],
                                       context->options());
              printer->Emit(
                  {
                      {"name", canonical_values[i]->name()},
                      {"number", absl::StrCat(canonical_values[i]->number())},
                      {"index", absl::StrCat(canonical_values[i]->index())},
                      {"deprecation",
                       canonical_values[i]->options().deprecated()
                           ? "@java.lang.Deprecated"
                           : ""},
                  },
                  R"(
                    $deprecation$
                    public static final $classname$ $name$ = new $classname$($number$, $index$, "$name$");

                    $deprecation$
                    public static final int $name$_VALUE = $number$;
                  )");
            }
          }},
         {"value_of_func",
          [&] {
            printer->Emit({{"cases",
                            [&] {
                              for (int i = start;
                                   i < std::min(start + kMaxEnums,
                                                (int)canonical_values.size());
                                   i++) {
                                printer->Emit(
                                    {{"name", canonical_values[i]->name()}},
                                    R"(
                                    case "$name$": return $name$;
                                    )");
                              }
                            }}},
                          R"(
                          switch (name) {
                            $cases$
                            default: return null;
                          }
                          )");
          }},
         {"for_number_func",
          [&] {
            printer->Emit(
                {{"cases",
                  [&] {
                    for (int i = start;
                         i < std::min(start + kMaxEnums,
                                      (int)canonical_values.size());
                         i++) {
                      printer->Emit(
                          {{"name", canonical_values[i]->name()},
                           {"number",
                            absl::StrCat(canonical_values[i]->number())}},
                          R"(
                            case $number$: return $name$;
                          )");
                    }
                  }}},
                R"(
                  switch (value) {
                    $cases$
                    default: return null;
                  }
                )");
          }},
         {"values_func",
          [&] {
            printer->Emit({{"values",
                            [&] {
                              std::vector<absl::string_view> values;
                              for (int i = start;
                                   i < std::min(start + kMaxEnums,
                                                (int)canonical_values.size());
                                   i++) {
                                values.push_back(canonical_values[i]->name());
                              }
                              printer->Emit(
                                  {{"values", absl::StrJoin(values, ", ")}},
                                  R"(
                                  $values$
                                  )");
                            }}},
                          R"(
                          return new $classname$[] {
                            $values$
                          };
                          )");
          }}},
        R"(
          interface $classname$$count$ {

            $enums$

            /**
             * @param value The numeric wire value of the corresponding enum entry.
             * @return The enum associated with the given numeric wire value.
             */
            $method_return_null_annotation$
            public static $classname$ forNumber$count$(int value) {
              $for_number_func$
            }

            /**
             * @param name The string name of the corresponding enum entry.
             * @return The enum associated with the given string name.
             */
            $method_return_null_annotation$
            public static $classname$ valueOf$count$(String name) {
              $value_of_func$
            }

            public static $classname$[] values$count$() {
              $values_func$
            }
          }
        )");
  }
}